

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::AllocateObjectSynchData
          (CPalSynchronizationManager *this,CObjectType *potObjectType,ObjectDomain odObjectDomain,
          VOID **ppvSynchData)

{
  CPalThread *pthrCurrent;
  CSynchData *shmptr;
  CSynchData *pCVar1;
  
  pthrCurrent = InternalGetCurrentThread();
  if (odObjectDomain == SharedObject) {
    shmptr = (CSynchData *)
             CSHRSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSHRSynchData,pthrCurrent);
    if (shmptr == (CSynchData *)0x0) {
LAB_0033ada8:
      if (PAL_InitializeChakraCoreCalled != false) {
        return 8;
      }
      abort();
    }
    pCVar1 = (CSynchData *)SHMPtrToPtr((SHMPTR)shmptr);
    if (pCVar1 == (CSynchData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AllocateObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x416);
      fprintf(_stderr,"Expression: NULL != psdSynchData, Description: Bad shared memory pointer\n");
    }
    (pCVar1->m_ptrWTLHead).shrid = 0;
    (pCVar1->m_ptrWTLTail).shrid = 0;
    pCVar1->m_shridThis = (SHMPTR)shmptr;
  }
  else {
    shmptr = CSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSynchData,pthrCurrent);
    if (shmptr == (CSynchData *)0x0) goto LAB_0033ada8;
    (shmptr->m_ptrWTLHead).shrid = 0;
    (shmptr->m_ptrWTLTail).shrid = 0;
    shmptr->m_shridThis = 0;
    pCVar1 = shmptr;
  }
  *ppvSynchData = shmptr;
  pCVar1->m_odObjectDomain = odObjectDomain;
  pCVar1->m_otiObjectTypeId = potObjectType->m_eTypeId;
  return 0;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::AllocateObjectSynchData(
        CObjectType *potObjectType,
        ObjectDomain odObjectDomain,
        VOID **ppvSynchData)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchData * psdSynchData = NULL;
        CPalThread * pthrCurrent = InternalGetCurrentThread();

        if (SharedObject == odObjectDomain)
        {
            SharedID shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
            if (NULLSharedID == shridSynchData)
            {
                ERROR("Unable to allocate shared memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }
            psdSynchData = SharedIDToTypePointer(CSynchData, shridSynchData);

            VALIDATEOBJECT(psdSynchData);

            _ASSERT_MSG(NULL != psdSynchData, "Bad shared memory pointer\n");

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadShrPtr(NULLSharedID);
            psdSynchData->SetWTLTailShrPtr(NULLSharedID);

            // Store shared pointer to this object
            psdSynchData->SetSharedThis(shridSynchData);

            *ppvSynchData = reinterpret_cast<void *>(shridSynchData);
        }
        else
        {
            psdSynchData = m_cacheSynchData.Get(pthrCurrent);
            if (NULL == psdSynchData)
            {
                ERROR("Unable to allocate memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadPtr(NULL);
            psdSynchData->SetWTLTailPtr(NULL);

            // Set shared this pointer to NULL
            psdSynchData->SetSharedThis(NULLSharedID);

            *ppvSynchData = static_cast<void *>(psdSynchData);
        }

        // Initialize object domain and object type;
        psdSynchData->SetObjectDomain(odObjectDomain);
        psdSynchData->SetObjectType(potObjectType);

    AOSD_exit:
        return palErr;
    }